

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *pcVar1;
  pointer pTVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pvVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  PolicyStatus PVar9;
  TargetType TVar10;
  ostream *poVar11;
  cmGlobalGenerator *pcVar12;
  cmExportSet *pcVar13;
  PackageDependency *pPVar14;
  string *psVar15;
  iterator iVar16;
  cmExportBuildFileGenerator *pcVar17;
  cmTarget *this;
  PackageDependencyExportEnabled PVar18;
  offset_in_Arguments_to_bool member;
  PolicyID id;
  char *pcVar19;
  char *extraout_RDX;
  string *ct;
  ulong uVar20;
  pointer pvVar21;
  pointer config;
  PackageDependencyArguments *this_00;
  long lVar22;
  undefined8 name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view value;
  string_view name_13;
  string_view input;
  string_view value_00;
  size_t sStack_6d0;
  char local_6b9;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  char local_689;
  PackageDependencyArguments packageDependencyArguments;
  _Any_data local_648;
  _Manager_type local_638;
  pointer ppStack_630;
  pointer local_628;
  pointer ppStack_620;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  _Head_base<0UL,_cmExportBuildFileGenerator_*,_false> local_5f0;
  string fname;
  _Any_data local_5a8;
  _Invoker_type local_598;
  pointer ppStack_590;
  pointer local_588;
  pointer ppStack_580;
  string local_578;
  cmArgumentParser<Arguments> parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  pointer local_4b8;
  undefined1 auStack_4b0 [8];
  _Function_base local_4a8;
  pointer ppStack_490;
  pointer local_488;
  pointer ppStack_480;
  Arguments arguments;
  string local_50 [32];
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"called with too few arguments",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configurationTypes);
    return false;
  }
  bVar7 = std::operator==(__lhs,"PACKAGE");
  if (bVar7) {
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)targets.
                          super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    lVar22 = 0x20;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&targets.
                   super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (uVar20 = 1;
        uVar20 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5); uVar20 = uVar20 + 1
        ) {
      if (lVar22 == 0x40) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar11 = std::operator<<((ostream *)&configurationTypes,"PACKAGE given unknown argument: ")
        ;
        std::operator<<(poVar11,(string *)
                                ((args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 2));
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&arguments);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
        goto LAB_0032feea;
      }
      std::__cxx11::string::_M_assign((string *)&targets);
      lVar22 = lVar22 + 0x20;
    }
    if (targets.
        super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configurationTypes,"PACKAGE must be given a package name.",
                 (allocator<char> *)&arguments);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&configurationTypes);
LAB_0032feea:
      bVar7 = false;
      goto LAB_00330af3;
    }
    cmsys::RegularExpression::RegularExpression((RegularExpression *)&arguments,"^[A-Za-z0-9_.-]+$")
    ;
    bVar7 = cmsys::RegularExpression::find
                      ((RegularExpression *)&arguments,
                       (char *)targets.
                               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (bVar7) {
      pcVar1 = status->Makefile;
      PVar9 = cmMakefile::GetPolicyStatus(pcVar1,CMP0090,false);
      if (PVar9 - NEW < 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"CMAKE_EXPORT_PACKAGE_REGISTRY",
                   (allocator<char> *)&parser);
        bVar8 = cmMakefile::IsOn(pcVar1,(string *)&configurationTypes);
        std::__cxx11::string::~string((string *)&configurationTypes);
        if (!bVar8) goto LAB_00330ae6;
      }
      else if (PVar9 < NEW) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY",
                   (allocator<char> *)&parser);
        bVar8 = cmMakefile::IsOn(pcVar1,(string *)&configurationTypes);
        std::__cxx11::string::~string((string *)&configurationTypes);
        if (bVar8) goto LAB_00330ae6;
      }
      psVar15 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
      cmCryptoHash::cmCryptoHash((cmCryptoHash *)&unknownArgs,AlgoMD5);
      input._M_str = (psVar15->_M_dataplus)._M_p;
      input._M_len = psVar15->_M_string_length;
      cmCryptoHash::HashString_abi_cxx11_(&local_578,(cmCryptoHash *)&unknownArgs,input);
      pcVar19 = (psVar15->_M_dataplus)._M_p;
      parser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&parser.super_Base.Bindings.Keywords.
                     super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     .
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      parser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      bVar8 = cmsys::SystemTools::GetEnv("HOME",(string *)&parser);
      if (bVar8) {
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&parser);
        std::__cxx11::string::append((char *)&parser);
        std::__cxx11::string::append((string *)&parser);
        cmsys::SystemTools::MakeDirectory((string *)&parser,(mode_t *)0x0);
        std::__cxx11::string::append((char *)&parser);
        std::__cxx11::string::append((char *)&parser);
        bVar8 = cmsys::SystemTools::FileExists((string *)&parser);
        if (!bVar8) {
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&configurationTypes,(string *)&parser,true,None);
          if ((local_4c8._M_local_buf
               [configurationTypes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5U) == 0) {
            poVar11 = std::operator<<((ostream *)&configurationTypes,pcVar19);
            std::operator<<(poVar11,"\n");
          }
          else {
            local_6b9 = '\n';
            cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
            local_689 = '\n';
            cmStrCat<char_const(&)[40],std::__cxx11::string&,char,std::__cxx11::string,char>
                      (&fname,(char (*) [40])"Cannot create package registry file:\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                       &local_6b9,&packageDependencyArguments.Enabled,&local_689);
            cmMakefile::IssueMessage(pcVar1,WARNING,&fname);
            std::__cxx11::string::~string((string *)&fname);
            std::__cxx11::string::~string((string *)&packageDependencyArguments);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&configurationTypes);
        }
      }
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::~string((string *)&local_578);
      cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&unknownArgs);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
      poVar11 = std::operator<<((ostream *)&configurationTypes,
                                "PACKAGE given invalid package name \"");
      poVar11 = std::operator<<(poVar11,(string *)&targets);
      poVar11 = std::operator<<(poVar11,"\".  ");
      poVar11 = std::operator<<(poVar11,"Package names must match \"");
      poVar11 = std::operator<<(poVar11,"^[A-Za-z0-9_.-]+$");
      std::operator<<(poVar11,"\".");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
    }
LAB_00330ae6:
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&arguments);
LAB_00330af3:
    std::__cxx11::string::~string((string *)&targets);
    return bVar7;
  }
  local_488 = (pointer)0x0;
  ppStack_480 = (pointer)0x0;
  local_4a8._M_manager = (_Manager_type)0x0;
  ppStack_490 = (pointer)0x0;
  local_4a8._M_functor._0_8_ = 0;
  local_4a8._M_functor._8_8_ = (_Manager_type)0x0;
  local_4b8 = (pointer)0x0;
  auStack_4b0 = (undefined1  [8])0x0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (_Manager_type)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&configurationTypes,name_00,0x40);
  name_01.super_string_view._M_str = "FILE";
  name_01.super_string_view._M_len = 4;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&configurationTypes,name_01,0x60);
  name_02.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
  name_02.super_string_view._M_len = 0x15;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&configurationTypes,name_02,0xa0);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)&parser,(ActionMap *)&configurationTypes);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&configurationTypes);
  bVar7 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
  if (bVar7) {
    name_03.super_string_view._M_str = "EXPORT";
    name_03.super_string_view._M_len = 6;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_03,0);
    bVar7 = cmExperimental::HasSupportEnabled(status->Makefile,ExportPackageDependencies);
    if (bVar7) {
      member = 0xe0;
      pcVar19 = "EXPORT_PACKAGE_DEPENDENCIES";
      sStack_6d0 = 0x1b;
LAB_0032fae6:
      name_10.super_string_view._M_str = pcVar19;
      name_10.super_string_view._M_len = sStack_6d0;
      cmArgumentParser<Arguments>::Bind<bool>(&parser,name_10,member);
    }
  }
  else {
    bVar7 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"SETUP");
    if (!bVar7) {
      configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x20;
      configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                    ::_M_manager;
      name_07._M_str = "TARGETS";
      name_07._M_len = 7;
      ArgumentParser::Base::Bind(&parser.super_Base,name_07,(KeywordAction *)&configurationTypes);
      std::_Function_base::~_Function_base((_Function_base *)&configurationTypes);
      name_08.super_string_view._M_str = "ANDROID_MK";
      name_08.super_string_view._M_len = 10;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parser,name_08,0x80);
      name_09.super_string_view._M_str = "APPEND";
      name_09.super_string_view._M_len = 6;
      cmArgumentParser<Arguments>::Bind<bool>(&parser,name_09,0xc0);
      member = 0xc1;
      pcVar19 = "EXPORT_LINK_INTERFACE_LIBRARIES";
      sStack_6d0 = 0x1f;
      goto LAB_0032fae6;
    }
    name_04.super_string_view._M_str = "SETUP";
    name_04.super_string_view._M_len = 5;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_04,0);
    bVar7 = cmExperimental::HasSupportEnabled(status->Makefile,ExportPackageDependencies);
    if (bVar7) {
      name_05.super_string_view._M_str = "PACKAGE_DEPENDENCY";
      name_05.super_string_view._M_len = 0x12;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parser,name_05,200);
    }
    name_06.super_string_view._M_str = "TARGET";
    name_06.super_string_view._M_len = 6;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parser,name_06,0xe8);
  }
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&unknownArgs;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.ExportSetName._M_dataplus._M_p = (pointer)&arguments.ExportSetName.field_2;
  arguments.ExportSetName._M_string_length = 0;
  arguments.ExportSetName.field_2._M_local_buf[0] = '\0';
  arguments.Targets.
  super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_engaged = false;
  arguments.Namespace._M_dataplus._M_p = (pointer)&arguments.Namespace.field_2;
  arguments.Namespace._M_string_length = 0;
  arguments.Namespace.field_2._M_local_buf[0] = '\0';
  arguments.Filename._M_dataplus._M_p = (pointer)&arguments.Filename.field_2;
  arguments.Filename._M_string_length = 0;
  arguments.Filename.field_2._M_local_buf[0] = '\0';
  arguments.AndroidMKFile._M_dataplus._M_p = (pointer)&arguments.AndroidMKFile.field_2;
  arguments.AndroidMKFile._M_string_length = 0;
  arguments.AndroidMKFile.field_2._M_local_buf[0] = '\0';
  arguments.CxxModulesDirectory._M_dataplus._M_p = (pointer)&arguments.CxxModulesDirectory.field_2;
  arguments.CxxModulesDirectory._M_string_length = 0;
  arguments.CxxModulesDirectory.field_2._M_local_buf[0] = '\0';
  arguments.Append = false;
  arguments.ExportOld = false;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.TargetArgs.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.TargetArgs.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.TargetArgs.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.PackageDependencyArgs.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  arguments._217_8_ = 0;
  arguments.PackageDependencyArgs.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.PackageDependencyArgs.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  arguments.PackageDependencyArgs.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (_Manager_type)0x0;
  local_4b8 = (pointer)0x0;
  auStack_4b0 = (undefined1  [8])0x0;
  local_4a8._M_functor._0_8_ = 0;
  local_4a8._M_functor._8_8_ = (_Manager_type)0x0;
  local_4a8._M_manager = (_Manager_type)0x0;
  ppStack_490 = (pointer)0x0;
  local_488 = (pointer)((ulong)local_488 & 0xffffffffffffff00);
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&parser;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&configurationTypes,args,0);
  std::_Function_base::~_Function_base(&local_4a8);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&fname,"Unknown argument: \"",
                   unknownArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &configurationTypes,&fname,"\".");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configurationTypes);
    std::__cxx11::string::~string((string *)&fname);
    bVar7 = false;
    goto LAB_00330c7e;
  }
  bVar7 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"SETUP");
  sVar6 = arguments.AndroidMKFile._M_string_length;
  if (bVar7) {
    pcVar12 = cmMakefile::GetGlobalGenerator(status->Makefile);
    pcVar13 = cmExportSetMap::operator[](&pcVar12->ExportSets,&arguments.ExportSetName);
    local_588 = (pointer)0x0;
    ppStack_580 = (pointer)0x0;
    local_598 = (_Invoker_type)0x0;
    ppStack_590 = (pointer)0x0;
    local_5a8._0_8_ = 0;
    local_5a8._8_8_ = (_Manager_type)0x0;
    fname.field_2._M_allocated_capacity = 0;
    fname.field_2._8_8_ = 0;
    fname._M_dataplus._M_p = (pointer)0x0;
    fname._M_string_length = 0;
    packageDependencyArguments.Enabled._M_dataplus._M_p = (pointer)0x0;
    packageDependencyArguments.Enabled._M_string_length = 0;
    packageDependencyArguments.Enabled.field_2._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    packageDependencyArguments.Enabled.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_manager;
    name_11._M_str = "ENABLED";
    name_11._M_len = 7;
    ArgumentParser::Base::Bind((Base *)&fname,name_11,(KeywordAction *)&packageDependencyArguments);
    std::_Function_base::~_Function_base((_Function_base *)&packageDependencyArguments);
    packageDependencyArguments.Enabled._M_string_length = 0;
    packageDependencyArguments.Enabled._M_dataplus._M_p = (pointer)0x20;
    packageDependencyArguments.Enabled.field_2._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    packageDependencyArguments.Enabled.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_manager;
    name_12._M_str = "EXTRA_ARGS";
    name_12._M_len = 10;
    ArgumentParser::Base::Bind((Base *)&fname,name_12,(KeywordAction *)&packageDependencyArguments);
    std::_Function_base::~_Function_base((_Function_base *)&packageDependencyArguments);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)&configurationTypes,(ActionMap *)&fname);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&fname);
    pvVar5 = (pointer)CONCAT71(arguments.PackageDependencyArgs.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                               arguments.PackageDependencyArgs.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    for (pvVar21 = arguments.PackageDependencyArgs.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar21 != pvVar5;
        pvVar21 = pvVar21 + 1) {
      pTVar2 = (pointer)(pvVar21->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
      targets.
      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(pvVar21->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      if (pTVar2 != targets.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        targets.
        super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&pTVar2->XcFrameworkLocation;
        packageDependencyArguments.Enabled._M_dataplus._M_p =
             (pointer)&packageDependencyArguments.Enabled.field_2;
        packageDependencyArguments.Enabled._M_string_length = 0;
        packageDependencyArguments.Enabled.field_2._M_allocated_capacity =
             packageDependencyArguments.Enabled.field_2._M_allocated_capacity & 0xffffffffffffff00;
        packageDependencyArguments.ExtraArgs.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fname._M_dataplus._M_p = (pointer)&configurationTypes;
        fname._M_string_length = 0;
        packageDependencyArguments.ExtraArgs.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        packageDependencyArguments.ExtraArgs.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fname.field_2._M_allocated_capacity = (size_type)&unknownArgs;
        local_588 = (pointer)((ulong)local_588 & 0xffffffffffffff00);
        local_598 = (_Invoker_type)0x0;
        ppStack_590 = (pointer)0x0;
        local_5a8._0_8_ = 0;
        local_5a8._8_8_ = (_Manager_type)0x0;
        fname.field_2._8_8_ = &packageDependencyArguments;
        ArgumentParser::Instance::
        Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((Instance *)&fname,
                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&targets,0);
        std::_Function_base::~_Function_base((_Function_base *)&local_5a8);
        if (unknownArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            unknownArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,"Unknown argument: \"",
                         unknownArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
          std::operator+(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&targets,"\".");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&fname);
          psVar15 = (string *)&targets;
LAB_0033049a:
          std::__cxx11::string::~string((string *)psVar15);
          cmExportCommand::PackageDependencyArguments::~PackageDependencyArguments
                    (&packageDependencyArguments);
          bVar7 = false;
          goto LAB_0033051a;
        }
        pPVar14 = cmExportSet::GetPackageDependencyForSetup
                            (pcVar13,(pvVar21->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
        if (packageDependencyArguments.Enabled._M_string_length != 0) {
          bVar7 = std::operator==(&packageDependencyArguments.Enabled,"AUTO");
          PVar18 = Auto;
          if (!bVar7) {
            value_00._M_str = packageDependencyArguments.Enabled._M_dataplus._M_p;
            value_00._M_len = packageDependencyArguments.Enabled._M_string_length;
            bVar7 = cmValue::IsOff(value_00);
            PVar18 = Off;
            if (!bVar7) {
              value._M_str = extraout_RDX;
              value._M_len = (size_t)packageDependencyArguments.Enabled._M_dataplus._M_p;
              bVar7 = cmValue::IsOn((cmValue *)packageDependencyArguments.Enabled._M_string_length,
                                    value);
              PVar18 = On;
              if (!bVar7) {
                cmStrCat<char_const(&)[49],std::__cxx11::string_const&,char_const(&)[2]>
                          (&fname,(char (*) [49])"Invalid enable setting for package dependency: \""
                           ,&packageDependencyArguments.Enabled,(char (*) [2])0x761966);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                psVar15 = &fname;
                goto LAB_0033049a;
              }
            }
          }
          pPVar14->Enabled = PVar18;
        }
        cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  (&pPVar14->ExtraArguments,&packageDependencyArguments.ExtraArgs);
        cmExportCommand::PackageDependencyArguments::~PackageDependencyArguments
                  (&packageDependencyArguments);
      }
    }
    local_628 = (pointer)0x0;
    ppStack_620 = (pointer)0x0;
    local_638 = (_Manager_type)0x0;
    ppStack_630 = (pointer)0x0;
    local_648._0_8_ = 0;
    local_648._8_8_ = (_Manager_type)0x0;
    packageDependencyArguments.ExtraArgs.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    packageDependencyArguments.ExtraArgs.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    packageDependencyArguments.ExtraArgs.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    packageDependencyArguments.Enabled.field_2._M_allocated_capacity = 0;
    packageDependencyArguments.Enabled.field_2._8_8_ = 0;
    packageDependencyArguments.Enabled._M_dataplus._M_p = (pointer)0x0;
    packageDependencyArguments.Enabled._M_string_length = 0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_manager;
    name_13._M_str = "XCFRAMEWORK_LOCATION";
    name_13._M_len = 0x14;
    ArgumentParser::Base::Bind
              ((Base *)&packageDependencyArguments,name_13,(KeywordAction *)&targets);
    std::_Function_base::~_Function_base((_Function_base *)&targets);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&fname,(ActionMap *)&packageDependencyArguments);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&packageDependencyArguments);
    pvVar5 = arguments.TargetArgs.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar21 = arguments.TargetArgs.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar7 = pvVar21 == pvVar5, !bVar7;
        pvVar21 = pvVar21 + 1) {
      pbVar3 = (pvVar21->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (pvVar21->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar3 != pbVar4) {
        local_578._M_dataplus._M_p = (pointer)(pbVar3 + 1);
        targets.
        super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&targets.
                       super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        targets.
        super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        packageDependencyArguments.Enabled._M_dataplus._M_p = (pointer)&fname;
        packageDependencyArguments.Enabled._M_string_length = 0;
        targets.
        super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)targets.
                              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        packageDependencyArguments.Enabled.field_2._M_allocated_capacity = (size_type)&unknownArgs;
        local_628 = (pointer)((ulong)local_628 & 0xffffffffffffff00);
        local_638 = (_Manager_type)0x0;
        ppStack_630 = (pointer)0x0;
        local_648._0_8_ = 0;
        local_648._8_8_ = (_Manager_type)0x0;
        packageDependencyArguments.ExtraArgs.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        packageDependencyArguments.ExtraArgs.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        packageDependencyArguments.ExtraArgs.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        packageDependencyArguments.Enabled.field_2._8_8_ = (string *)&targets;
        local_578._M_string_length = (size_type)pbVar4;
        ArgumentParser::Instance::
        Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((Instance *)&packageDependencyArguments,
                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&local_578,0);
        std::_Function_base::~_Function_base((_Function_base *)&local_648);
        if (unknownArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            unknownArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(&local_578,"Unknown argument: \"",
                         unknownArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
          std::operator+(&packageDependencyArguments.Enabled,&local_578,"\".");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&packageDependencyArguments);
          std::__cxx11::string::~string((string *)&local_578);
          std::__cxx11::string::~string((string *)&targets);
          break;
        }
        cmExportSet::SetXcFrameworkLocation
                  (pcVar13,(pvVar21->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,(string *)&targets);
        std::__cxx11::string::~string((string *)&targets);
      }
    }
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&fname);
LAB_0033051a:
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&configurationTypes);
    goto LAB_00330c7e;
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_allocated_capacity = fname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (arguments.AndroidMKFile._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&fname);
  }
  if (arguments.Filename._M_string_length == 0) {
    if (fname._M_string_length != 0) goto LAB_0033057f;
    bVar7 = std::operator!=((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (!bVar7) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,&arguments.ExportSetName,".cmake");
      std::__cxx11::string::operator=((string *)&fname,(string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&configurationTypes);
      goto LAB_0033057f;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configurationTypes,"FILE <filename> option missing.",
               (allocator<char> *)&packageDependencyArguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configurationTypes);
LAB_0033062e:
    bVar7 = false;
  }
  else {
    if (fname._M_string_length == 0) {
      cmsys::SystemTools::GetFilenameLastExtension
                ((string *)&configurationTypes,&arguments.Filename);
      bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &configurationTypes,".cmake");
      std::__cxx11::string::~string((string *)&configurationTypes);
      if (!bVar7) {
        std::__cxx11::string::_M_assign((string *)&fname);
        goto LAB_0033057f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
      poVar11 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
      poVar11 = std::operator<<(poVar11,(string *)&arguments.Filename);
      std::operator<<(poVar11,"\" which does not have an extension of \".cmake\".\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00330617:
      std::__cxx11::string::~string((string *)&packageDependencyArguments);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
      goto LAB_0033062e;
    }
LAB_0033057f:
    pcVar1 = status->Makefile;
    bVar7 = cmsys::SystemTools::FileIsFullPath(&fname);
    if (bVar7) {
      bVar7 = cmMakefile::CanIWriteThisFile(pcVar1,&fname);
      if (!bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar11 = std::operator<<((ostream *)&configurationTypes,"FILE option given filename \"");
        poVar11 = std::operator<<(poVar11,(string *)&fname);
        std::operator<<(poVar11,"\" which is in the source tree.\n");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00330617;
      }
    }
    else {
      psVar15 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
      std::operator+(&packageDependencyArguments.Enabled,psVar15,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,&packageDependencyArguments.Enabled,&fname);
      std::__cxx11::string::operator=((string *)&fname,(string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&packageDependencyArguments);
    }
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar12 = cmMakefile::GetGlobalGenerator(pcVar1);
    bVar7 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (bVar7) {
      iVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                       *)&pcVar12->ExportSets,&arguments.ExportSetName);
      if ((_Rb_tree_header *)iVar16._M_node ==
          &(pcVar12->ExportSets).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
        poVar11 = std::operator<<((ostream *)&configurationTypes,"Export set \"");
        poVar11 = std::operator<<(poVar11,(string *)&arguments);
        std::operator<<(poVar11,"\" not found.");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00330c4e:
        std::__cxx11::string::~string((string *)&packageDependencyArguments);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&configurationTypes);
LAB_00330c65:
        bVar7 = false;
      }
      else {
        pcVar13 = (cmExportSet *)(iVar16._M_node + 2);
LAB_003306fa:
        pcVar17 = cmGlobalGenerator::GetExportedTargetsFile(pcVar12,&fname);
        if ((pcVar17 != (cmExportBuildFileGenerator *)0x0) &&
           (PVar9 = cmMakefile::GetPolicyStatus(pcVar1,CMP0103,false), PVar9 != OLD)) {
          if (PVar9 != WARN) {
            cmStrCat<char_const(&)[42],std::__cxx11::string_const&,char_const(&)[32]>
                      ((string *)&configurationTypes,(char (*) [42])0x7404ab,&arguments.Filename,
                       (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00330b3a;
          }
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    (&packageDependencyArguments.Enabled,(cmPolicies *)0x67,id);
          local_578._M_dataplus._M_p._0_1_ = 10;
          cmStrCat<std::__cxx11::string,char,char_const(&)[51],std::__cxx11::string_const&,char_const(&)[32]>
                    ((string *)&configurationTypes,&packageDependencyArguments.Enabled,
                     (char *)&local_578,
                     (char (*) [51])"export() command already specified for the file\n  ",
                     &arguments.Filename,(char (*) [32])"\nDid you miss \'APPEND\' keyword?");
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&configurationTypes);
          std::__cxx11::string::~string((string *)&configurationTypes);
          std::__cxx11::string::~string((string *)&packageDependencyArguments);
        }
        if (sVar6 == 0) {
          std::make_unique<cmExportBuildFileGenerator>();
        }
        else {
          std::make_unique<cmExportBuildAndroidMKGenerator>();
        }
        pbVar3 = configurationTypes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        cmExportFileGenerator::SetExportFile
                  ((cmExportFileGenerator *)
                   configurationTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,fname._M_dataplus._M_p);
        std::__cxx11::string::_M_assign((string *)&pbVar3->_M_string_length);
        std::__cxx11::string::string(local_50,(string *)&arguments.CxxModulesDirectory);
        std::__cxx11::string::operator=((string *)(pbVar3[0xc].field_2._M_local_buf + 8),local_50);
        std::__cxx11::string::~string(local_50);
        *(bool *)&pbVar3[6]._M_string_length = arguments.Append;
        if (pcVar13 == (cmExportSet *)0x0) {
          std::
          vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
          ::operator=((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                       *)((long)&pbVar3[10].field_2 + 8),&targets);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet((cmExportBuildFileGenerator *)pbVar3,pcVar13);
        }
        *(bool *)&pbVar3[1]._M_string_length = arguments.ExportOld;
        pbVar3[10].field_2._M_local_buf[4] = arguments.ExportPackageDependencies;
        cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configurationTypes,pcVar1,IncludeEmptyConfig);
        pbVar4 = configurationTypes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (config = configurationTypes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; config != pbVar4;
            config = config + 1) {
          cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)pbVar3,config);
        }
        if (pcVar13 == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(pcVar12,(cmExportBuildFileGenerator *)pbVar3);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(pcVar12,(cmExportBuildFileGenerator *)pbVar3);
        }
        local_5f0._M_head_impl = (cmExportBuildFileGenerator *)pbVar3;
        cmMakefile::AddExportBuildFileGenerator
                  (pcVar1,(unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                           *)&local_5f0);
        if (local_5f0._M_head_impl != (cmExportBuildFileGenerator *)0x0) {
          (*((local_5f0._M_head_impl)->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[1])
                    ();
        }
        local_5f0._M_head_impl = (cmExportBuildFileGenerator *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&configurationTypes);
        bVar7 = true;
      }
    }
    else {
      if (arguments.Targets.
          super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_engaged != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configurationTypes,"EXPORT or TARGETS specifier missing.",
                   (allocator<char> *)&packageDependencyArguments);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00330b3a:
        this_00 = (PackageDependencyArguments *)&configurationTypes;
LAB_00330b42:
        std::__cxx11::string::~string((string *)this_00);
        goto LAB_00330c65;
      }
      for (name = arguments.Targets.
                  super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_payload._M_value.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          (pointer)name !=
          arguments.Targets.
          super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_payload._M_value.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; name = name + 0x20) {
        bVar7 = cmMakefile::IsAlias(pcVar1,(string *)name);
        if (bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar11 = std::operator<<((ostream *)&configurationTypes,"given ALIAS target \"");
          poVar11 = std::operator<<(poVar11,(string *)name);
          std::operator<<(poVar11,"\" which may not be exported.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00330c4e;
        }
        this = cmGlobalGenerator::FindTarget(pcVar12,(string *)name,false);
        if (this == (cmTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&configurationTypes);
          poVar11 = std::operator<<((ostream *)&configurationTypes,"given target \"");
          poVar11 = std::operator<<(poVar11,(string *)name);
          std::operator<<(poVar11,"\" which is not built by this project.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00330c4e;
        }
        TVar10 = cmTarget::GetType(this);
        if (TVar10 == UTILITY) {
          std::operator+(&packageDependencyArguments.Enabled,"given custom target \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &configurationTypes,&packageDependencyArguments.Enabled,
                         "\" which may not be exported.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&configurationTypes);
          this_00 = &packageDependencyArguments;
          goto LAB_00330b42;
        }
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&configurationTypes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)configurationTypes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        std::
        vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
        ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string>
                  ((vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
                    *)&targets,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &configurationTypes);
        std::__cxx11::string::~string((string *)&configurationTypes);
      }
      if ((arguments.Append != true) ||
         (pcVar17 = cmGlobalGenerator::GetExportedTargetsFile(pcVar12,&fname),
         pcVar17 == (cmExportBuildFileGenerator *)0x0)) {
        pcVar13 = (cmExportSet *)0x0;
        goto LAB_003306fa;
      }
      bVar7 = true;
      cm::
      append<std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>,_0>
                (&pcVar17->Targets,&targets);
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::~vector(&targets);
  }
  std::__cxx11::string::~string((string *)&fname);
LAB_00330c7e:
  cmExportCommand::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parser);
  return bVar7;
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;

    std::vector<std::vector<std::string>> PackageDependencyArgs;
    bool ExportPackageDependencies = false;

    std::vector<std::vector<std::string>> TargetArgs;
  };

  auto parser =
    cmArgumentParser<Arguments>{}
      .Bind("NAMESPACE"_s, &Arguments::Namespace)
      .Bind("FILE"_s, &Arguments::Filename)
      .Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("EXPORT_PACKAGE_DEPENDENCIES"_s,
                  &Arguments::ExportPackageDependencies);
    }
  } else if (args[0] == "SETUP") {
    parser.Bind("SETUP"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("PACKAGE_DEPENDENCY"_s, &Arguments::PackageDependencyArgs);
    }
    parser.Bind("TARGET"_s, &Arguments::TargetArgs);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  if (args[0] == "SETUP") {
    cmMakefile& mf = status.GetMakefile();
    cmGlobalGenerator* gg = mf.GetGlobalGenerator();

    cmExportSetMap& setMap = gg->GetExportSets();
    auto& exportSet = setMap[arguments.ExportSetName];

    struct PackageDependencyArguments
    {
      std::string Enabled;
      ArgumentParser::MaybeEmpty<std::vector<std::string>> ExtraArgs;
    };

    auto packageDependencyParser =
      cmArgumentParser<PackageDependencyArguments>{}
        .Bind("ENABLED"_s, &PackageDependencyArguments::Enabled)
        .Bind("EXTRA_ARGS"_s, &PackageDependencyArguments::ExtraArgs);

    for (auto const& packageDependencyArgs : arguments.PackageDependencyArgs) {
      if (packageDependencyArgs.empty()) {
        continue;
      }

      PackageDependencyArguments const packageDependencyArguments =
        packageDependencyParser.Parse(
          cmMakeRange(packageDependencyArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      auto& packageDependency =
        exportSet.GetPackageDependencyForSetup(packageDependencyArgs.front());

      if (!packageDependencyArguments.Enabled.empty()) {
        if (packageDependencyArguments.Enabled == "AUTO") {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Auto;
        } else if (cmIsOff(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Off;
        } else if (cmIsOn(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::On;
        } else {
          status.SetError(
            cmStrCat("Invalid enable setting for package dependency: \"",
                     packageDependencyArguments.Enabled, "\""));
          return false;
        }
      }

      cm::append(packageDependency.ExtraArguments,
                 packageDependencyArguments.ExtraArgs);
    }

    struct TargetArguments
    {
      std::string XcFrameworkLocation;
    };

    auto targetParser = cmArgumentParser<TargetArguments>{}.Bind(
      "XCFRAMEWORK_LOCATION"_s, &TargetArguments::XcFrameworkLocation);

    for (auto const& targetArgs : arguments.TargetArgs) {
      if (targetArgs.empty()) {
        continue;
      }

      TargetArguments const targetArguments =
        targetParser.Parse(cmMakeRange(targetArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      exportSet.SetXcFrameworkLocation(targetArgs.front(),
                                       targetArguments.XcFrameworkLocation);
    }

    return true;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<cmExportBuildFileGenerator::TargetExport> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.emplace_back(currentTarget, std::string{});
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);
  ebfg->SetExportPackageDependencies(arguments.ExportPackageDependencies);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}